

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O3

int ncnn::deconvolution(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                       int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,
                       int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  bool bVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int extraout_EAX;
  ulong extraout_RAX;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  void *pvVar14;
  float *pfVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  Mat *pMVar20;
  bool bVar21;
  undefined4 uVar22;
  float fVar23;
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar25 [16];
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int size;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_119;
  float *local_118;
  ulong local_110;
  Mat *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  void *local_e8;
  int local_dc;
  undefined1 local_d8 [16];
  ulong local_c0;
  ulong local_b8;
  Mat *local_b0;
  ulong local_a8;
  void *local_a0;
  void *local_98;
  Mat *local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  long local_70;
  void *local_68;
  long local_60;
  undefined1 local_58 [16];
  vector<int,_std::allocator<int>_> local_48;
  
  iVar26 = top_blob->w;
  local_c0 = (ulong)(uint)top_blob->c;
  uVar9 = kernel_h * kernel_w;
  local_108 = bias_data;
  local_b0 = bottom_blob;
  local_90 = weight_data;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar9,&local_119);
  uVar11 = extraout_RAX;
  if (0 < kernel_h) {
    uVar11 = (ulong)(uint)dilation_w;
    iVar12 = 0;
    iVar17 = 0;
    iVar18 = 0;
    do {
      if (0 < kernel_w) {
        lVar19 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar12 + lVar19] = iVar17;
          iVar17 = iVar17 + dilation_w;
          lVar19 = lVar19 + 1;
        } while (kernel_w != (int)lVar19);
        iVar12 = iVar12 + (int)lVar19;
      }
      iVar17 = iVar17 + (iVar26 * dilation_h - dilation_w * kernel_w);
      iVar18 = iVar18 + 1;
    } while (iVar18 != kernel_h);
  }
  if (0 < (int)local_c0) {
    iVar26 = top_blob->w;
    pvVar14 = top_blob->data;
    uVar11 = top_blob->elemsize;
    local_b8 = top_blob->cstep * uVar11;
    lVar19 = (long)top_blob->h * (long)iVar26;
    local_100 = 0;
    local_a0 = local_108->data;
    bVar21 = local_a0 != (void *)0x0;
    iVar12 = local_108->c;
    sVar3 = local_108->cstep;
    iVar17 = (int)((uVar11 * lVar19 + 0xf & 0xfffffffffffffff0) / uVar11);
    if (top_blob->dims == 4) {
      iVar17 = (int)lVar19;
    }
    uVar10 = iVar17 * top_blob->d;
    local_80 = (ulong)uVar10;
    uVar2 = local_b0->c;
    local_f8 = (ulong)(uint)(top_blob->h * iVar26);
    local_60 = (long)stride_w;
    local_70 = (long)stride_h * uVar11 * (long)iVar26;
    local_88 = (ulong)(uVar10 + 3 & 0xfffffffc);
    lVar19 = local_80 - 1;
    auVar29._8_4_ = (int)lVar19;
    auVar29._0_8_ = lVar19;
    auVar29._12_4_ = (int)((ulong)lVar19 >> 0x20);
    local_dc = uVar2 * uVar9;
    auVar29 = auVar29 ^ _DAT_005a5070;
    local_f0 = (ulong)(activation_type - 1);
    local_108 = (Mat *)(ulong)(uint)local_b0->w;
    local_a8 = (ulong)(uint)local_b0->h;
    lVar19 = (long)pvVar14 + 0xc;
    local_110 = 0;
    auVar30 = _DAT_005a5c00;
    auVar31 = _DAT_005a5c10;
    auVar32 = _DAT_005a5070;
    local_98 = pvVar14;
    local_58 = auVar29;
    do {
      uVar22 = 0;
      if ((long)iVar12 * sVar3 != 0 && bVar21) {
        uVar22 = *(undefined4 *)((long)local_a0 + local_110 * 4);
      }
      if (0 < (int)local_80) {
        uVar11 = 0;
        do {
          auVar24._8_4_ = (int)uVar11;
          auVar24._0_8_ = uVar11;
          auVar24._12_4_ = (int)(uVar11 >> 0x20);
          auVar25 = (auVar24 | auVar31) ^ auVar32;
          iVar17 = auVar29._0_4_;
          bVar7 = iVar17 < auVar25._0_4_;
          iVar26 = auVar25._4_4_;
          iVar18 = auVar29._4_4_;
          if ((bool)(~(iVar18 < iVar26 || iVar26 == iVar18 && bVar7) & 1)) {
            *(undefined4 *)(lVar19 + -0xc + uVar11 * 4) = uVar22;
          }
          if (iVar18 >= iVar26 && (iVar26 != iVar18 || !bVar7)) {
            *(undefined4 *)(lVar19 + -8 + uVar11 * 4) = uVar22;
          }
          auVar24 = (auVar24 | auVar30) ^ auVar32;
          iVar26 = auVar24._4_4_;
          if (iVar26 <= iVar18 && (iVar26 != iVar18 || auVar24._0_4_ <= iVar17)) {
            *(undefined4 *)(lVar19 + -4 + uVar11 * 4) = uVar22;
            *(undefined4 *)(lVar19 + uVar11 * 4) = uVar22;
          }
          uVar11 = uVar11 + 4;
        } while (local_88 != uVar11);
      }
      if (0 < (int)local_a8) {
        local_68 = (void *)(local_b8 * local_110 + (long)local_98);
        local_118 = (float *)((long)(int)local_100 * 4 + (long)local_90->data);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_d8._8_8_;
        local_d8 = auVar25 << 0x40;
        do {
          if (0 < (int)local_108) {
            iVar26 = local_b0->w;
            sVar4 = local_b0->elemsize;
            sVar5 = local_b0->cstep;
            pvVar6 = local_b0->data;
            pMVar20 = (Mat *)0x0;
            do {
              if (0 < (int)uVar2) {
                lVar8 = (long)pMVar20 * local_60 * 4 + local_d8._0_8_ * local_70;
                uVar11 = 0;
                pfVar15 = local_118;
                do {
                  if (0 < (int)uVar9) {
                    fVar23 = *(float *)((long)pvVar6 +
                                       sVar5 * sVar4 * uVar11 +
                                       (long)pMVar20 * 4 + (long)iVar26 * local_d8._0_8_ * sVar4);
                    uVar13 = 0;
                    do {
                      *(float *)((long)local_68 +
                                (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[uVar13] * 4 + lVar8) =
                           pfVar15[uVar13] * fVar23 +
                           *(float *)((long)local_68 +
                                     (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar13] * 4 +
                                     lVar8);
                      uVar13 = uVar13 + 1;
                    } while (uVar9 != uVar13);
                  }
                  uVar11 = uVar11 + 1;
                  pfVar15 = pfVar15 + (int)uVar9;
                } while (uVar11 != uVar2);
              }
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
            } while (pMVar20 != local_108);
          }
          uVar11 = local_d8._0_8_ + 1;
          local_d8._0_8_ = uVar11;
        } while (uVar11 != local_a8);
      }
      local_e8 = pvVar14;
      local_78 = lVar19;
      if (0 < (int)local_f8) {
        local_118 = (float *)activation_params->data;
        uVar16 = 0;
        uVar11 = local_f0;
        uVar13 = local_f8;
        do {
          fVar23 = *(float *)((long)pvVar14 + uVar16 * 4);
          fVar28 = fVar23;
          if ((uint)uVar11 < 6) {
            switch((long)&switchD_00285190::switchdataD_005a9d90 +
                   (long)(int)(&switchD_00285190::switchdataD_005a9d90)[uVar11]) {
            case 0x285192:
              if (fVar23 <= 0.0) {
                fVar28 = 0.0;
              }
              break;
            case 0x2851a2:
              local_d8 = ZEXT416((uint)fVar23);
              fVar23 = expf(fVar23);
              fVar23 = logf(fVar23 + 1.0);
              fVar23 = tanhf(fVar23);
              pvVar14 = local_e8;
              uVar11 = local_f0;
              uVar13 = local_f8;
              auVar29 = local_58;
              auVar30 = _DAT_005a5c00;
              auVar31 = _DAT_005a5c10;
              auVar32 = _DAT_005a5070;
              fVar28 = fVar23 * (float)local_d8._0_4_;
              break;
            case 0x285208:
              if (fVar23 <= *local_118) {
                fVar23 = *local_118;
              }
              fVar28 = local_118[1];
              if (fVar23 <= local_118[1]) {
                fVar28 = fVar23;
              }
              break;
            case 0x285227:
              if (88.37626 <= fVar23) {
                fVar23 = 88.37626;
              }
              fVar23 = expf((float)(-(uint)(fVar23 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar23 < -88.37626) & ((uint)fVar23 ^ auVar32._0_4_)));
              pvVar14 = local_e8;
              uVar11 = local_f0;
              uVar13 = local_f8;
              auVar29 = local_58;
              auVar30 = _DAT_005a5c00;
              auVar31 = _DAT_005a5c10;
              auVar32 = _DAT_005a5070;
              fVar28 = 1.0 / (fVar23 + 1.0);
              break;
            case 0x2852a8:
              fVar28 = (float)(~-(uint)(0.0 < fVar23) & (uint)*local_118 |
                              -(uint)(0.0 < fVar23) & 0x3f800000) * fVar23;
              break;
            case 0x2852d4:
              fVar1 = *local_118;
              fVar27 = (float)((uint)local_118[1] ^ auVar32._0_4_) / fVar1;
              fVar28 = 0.0;
              if ((fVar27 <= fVar23) && (fVar28 = fVar23, fVar23 <= fVar27 + 1.0 / fVar1)) {
                fVar28 = (fVar1 * fVar23 + local_118[1]) * fVar23;
              }
            }
          }
          *(float *)((long)pvVar14 + uVar16 * 4) = fVar28;
          uVar16 = uVar16 + 1;
        } while (uVar13 != uVar16);
      }
      local_110 = local_110 + 1;
      lVar19 = local_78 + local_b8;
      local_100 = (ulong)(uint)((int)local_100 + local_dc);
      pvVar14 = (void *)((long)pvVar14 + local_b8);
      uVar11 = local_b8;
    } while (local_110 != local_c0);
  }
  iVar26 = (int)uVar11;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX;
  }
  return iVar26;
}

Assistant:

static int deconvolution(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int outw = top_blob.w;
    const int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias = bias_data.empty() ? 0.f : bias_data[p];

        out.fill(bias);

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int inch = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i * stride_h) + j * stride_w;

                const float* kptr = (const float*)weight_data + maxk * inch * p;

                for (int q = 0; q < inch; q++)
                {
                    const float val = bottom_blob.channel(q).row(i)[j];

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
            }
        }
    }

    return 0;
}